

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplex_test.cc
# Opt level: O2

void __thiscall
fizplex::SimplexTest_FourRowsFourVarsOptimalSolution_Test::
~SimplexTest_FourRowsFourVarsOptimalSolution_Test
          (SimplexTest_FourRowsFourVarsOptimalSolution_Test *this)

{
  SimplexTest::~SimplexTest(&this->super_SimplexTest);
  operator_delete(this,0xc0);
  return;
}

Assistant:

TEST_F(SimplexTest, FourRowsFourVarsOptimalSolution) {
  lp.add_column(ColType::Free, -inf, inf, 3);
  lp.add_column(ColType::Free, -inf, inf, -2);
  lp.add_column(ColType::LowerBound, 0.0, inf, 1);
  lp.add_column(ColType::LowerBound, 0.0, inf, -4);
  lp.add_row(RowType::GE, 4, inf, {1, 1, -4, 2});
  lp.add_row(RowType::LE, -inf, 6, {-3, 1, -2, 0});
  lp.add_row(RowType::Equality, -1, -1, {0, 1, 0, -1});
  lp.add_row(RowType::Equality, 0, 0, {1, 1, -1, 0});

  solve_lp();
  EXPECT_EQ(Simplex::Result::OptimalSolution, result);
  EXPECT_TRUE(is_eq_norm(-32.0, z));
}